

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O2

set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
* spvtools::opt::anon_unknown_21::GetLocationsAccessed
            (set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
             *__return_storage_ptr__,
            map<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
            *stores,map<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
                    *loads)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var2 = (stores->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(stores->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::
    _Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
    ::_M_insert_unique<spvtools::opt::Instruction*const&>
              ((_Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                *)__return_storage_ptr__,(Instruction **)(p_Var2 + 1));
  }
  for (p_Var2 = (loads->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(loads->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::
    _Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
    ::_M_insert_unique<spvtools::opt::Instruction*const&>
              ((_Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                *)__return_storage_ptr__,(Instruction **)(p_Var2 + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<Instruction*> GetLocationsAccessed(
    const std::map<Instruction*, std::vector<Instruction*>>& stores,
    const std::map<Instruction*, std::vector<Instruction*>>& loads) {
  std::set<Instruction*> locations{};

  for (const auto& kv : stores) {
    locations.insert(std::get<0>(kv));
  }

  for (const auto& kv : loads) {
    locations.insert(std::get<0>(kv));
  }

  return locations;
}